

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.h
# Opt level: O0

void __thiscall leveldb::SnapshotList::Delete(SnapshotList *this,SnapshotImpl *snapshot)

{
  long lVar1;
  long *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI[4] != in_RDI) {
    __assert_fail("snapshot->list_ == this",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/snapshot.h"
                  ,0x51,"void leveldb::SnapshotList::Delete(const SnapshotImpl *)");
  }
  *(long *)(in_RSI[1] + 0x10) = in_RSI[2];
  *(long *)(in_RSI[2] + 8) = in_RSI[1];
  if (in_RSI != (long *)0x0) {
    (**(code **)(*in_RSI + 8))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Delete(const SnapshotImpl* snapshot) {
#if !defined(NDEBUG)
    assert(snapshot->list_ == this);
#endif  // !defined(NDEBUG)
    snapshot->prev_->next_ = snapshot->next_;
    snapshot->next_->prev_ = snapshot->prev_;
    delete snapshot;
  }